

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::ascii::Identifier> *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  Identifier v;
  optional<tinyusdz::ascii::Identifier> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::ascii::Identifier>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    Identifier::Identifier((Identifier *)local_48);
    this_local._7_1_ = ReadBasicType(this,(Identifier *)local_48);
    if (this_local._7_1_) {
      nonstd::optional_lite::optional<tinyusdz::ascii::Identifier>::operator=
                (value,(Identifier *)local_48);
    }
    Identifier::~Identifier((Identifier *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<Identifier> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  Identifier v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}